

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int sha1_input(sha1_context *context,uint8_t *message_array,uint length)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  long lVar4;
  int iVar5;
  
  if (length == 0) {
    iVar5 = 0;
  }
  else if (message_array == (uint8_t *)0x0 || context == (sha1_context *)0x0) {
    iVar5 = 1;
  }
  else if (context->computed == 0) {
    iVar5 = context->corrupted;
    if (iVar5 == 0) {
      iVar5 = 0;
      lVar4 = 0;
      while ((length != (uint)lVar4 && (context->corrupted == 0))) {
        uVar2 = message_array[lVar4];
        sVar3 = context->message_block_index;
        context->message_block_index = sVar3 + 1;
        context->message_block[sVar3] = uVar2;
        puVar1 = &context->length_low;
        *puVar1 = *puVar1 + 8;
        if (*puVar1 == 0) {
          puVar1 = &context->length_high;
          *puVar1 = *puVar1 + 1;
          if (*puVar1 == 0) {
            context->corrupted = 1;
          }
        }
        if (context->message_block_index == 0x40) {
          sha1_process_message_block(context);
        }
        lVar4 = lVar4 + 1;
      }
    }
  }
  else {
    context->corrupted = 3;
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int sha1_input(sha1_context *context,
               const uint8_t *message_array,
               unsigned length)
{
	if (!length) {
		return SHA_SUCCESS;
	}

	if ((!context) || (!message_array)) {
		return SHA_NULL;
	}

	if (context->computed) {
		context->corrupted = SHA_STATE_ERROR;

		return SHA_STATE_ERROR;
	}

	if (context->corrupted) {
		return context->corrupted;
	}
	while ((length--) && (!context->corrupted)) {
		context->message_block[context->message_block_index++] =
		    (*message_array & 0xFFU);

		context->length_low += 8;
		if (context->length_low == 0) {
			context->length_high++;
			if (context->length_high == 0) {
				/* Message is too long */
				context->corrupted = 1;
			}
		}

		if (context->message_block_index == 64) {
			sha1_process_message_block(context);
		}

		message_array++;
	}

	return SHA_SUCCESS;
}